

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3PutVarint(char *p,sqlite_int64 v)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  sqlite_uint64 vu;
  uchar *q;
  
  lVar3 = 0;
  do {
    lVar4 = lVar3;
    bVar2 = (byte)v;
    p[lVar4] = bVar2 | 0x80;
    bVar1 = 0x7f < (ulong)v;
    lVar3 = lVar4 + 1;
    v = (ulong)v >> 7;
  } while (bVar1);
  p[lVar4] = bVar2;
  return (int)(lVar4 + 1);
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PutVarint(char *p, sqlite_int64 v){
  unsigned char *q = (unsigned char *) p;
  sqlite_uint64 vu = v;
  do{
    *q++ = (unsigned char) ((vu & 0x7f) | 0x80);
    vu >>= 7;
  }while( vu!=0 );
  q[-1] &= 0x7f;  /* turn off high bit in final byte */
  assert( q - (unsigned char *)p <= FTS3_VARINT_MAX );
  return (int) (q - (unsigned char *)p);
}